

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O1

Result __thiscall
testing::Action<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>::
Perform(Action<solitaire::colliders::interfaces::TableauPileCollider_&(solitaire::piles::PileId)>
        *this,ArgumentTuple *args)

{
  TableauPileCollider *pTVar1;
  PileId local_14;
  
  if ((this->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  if ((this->fun_).super__Function_base._M_manager != (_Manager_type)0x0) {
    pTVar1 = (*(this->fun_)._M_invoker)((_Any_data *)this,&local_14);
    return pTVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }